

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

int in_permitted_area_end_bit(tgestate_t *state,uint8_t room_and_flags)

{
  byte bVar1;
  bool bVar2;
  
  if ((char)room_and_flags < '\0') {
    bVar2 = state->room_index == (room_and_flags & 0x7f);
  }
  else {
    if (state->room_index == 0) {
      bVar1 = (state->hero_mappos).u;
      if (((within_camp_bounds::permitted_bounds[room_and_flags].x0 <= bVar1) &&
          (bVar1 < within_camp_bounds::permitted_bounds[room_and_flags].x1)) &&
         (bVar1 = (state->hero_mappos).v,
         within_camp_bounds::permitted_bounds[room_and_flags].y0 <= bVar1)) {
        bVar2 = bVar1 < within_camp_bounds::permitted_bounds[room_and_flags].y1;
        goto LAB_00107f73;
      }
    }
    bVar2 = false;
  }
LAB_00107f73:
  return (int)bVar2;
}

Assistant:

int in_permitted_area_end_bit(tgestate_t *state, uint8_t room_and_flags)
{
  room_t room; /* was HL */

  assert(state != NULL);

  room = state->room_index; /* Conv: Dereferenced up-front once. */

  if (room_and_flags & permitted_route_ROOM)
  {
    /* Hero should be in the specified room. */
    ASSERT_ROOM_VALID(room_and_flags & ~permitted_route_ROOM);
    return room == (room_and_flags & ~permitted_route_ROOM);
  }
  else if (room == room_0_OUTDOORS) // is outside
  {
    /* Hero is outdoors - check bounds. */
    return within_camp_bounds(room_and_flags, &state->hero_mappos);
  }
  else
  {
    /* Hero should be outside but is in room - not permitted. */
    return 0;
  }
}